

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

uint unqliteSanityzeFlag(uint iFlags)

{
  undefined4 local_c;
  uint iFlags_local;
  
  local_c = iFlags & 0xfffffff7;
  if ((iFlags & 0x10) != 0) {
    local_c = local_c | 0x44;
  }
  if ((local_c & 3) == 0) {
    local_c = local_c | 2;
  }
  if ((local_c & 4) == 0) {
    if ((local_c & 1) == 0) {
      if ((local_c & 2) != 0) {
        local_c = local_c & 0xfffffeff;
      }
    }
    else {
      local_c = local_c & 0xfffffffd;
    }
  }
  else {
    local_c = local_c & 0xfffffefe | 2;
  }
  return local_c;
}

Assistant:

static unsigned int unqliteSanityzeFlag(unsigned int iFlags)
{
	iFlags &= ~UNQLITE_OPEN_EXCLUSIVE; /* Reserved flag */
	if( iFlags & UNQLITE_OPEN_TEMP_DB ){
		/* Omit journaling for temporary database */
		iFlags |= UNQLITE_OPEN_OMIT_JOURNALING|UNQLITE_OPEN_CREATE;
	}
	if( (iFlags & (UNQLITE_OPEN_READONLY|UNQLITE_OPEN_READWRITE)) == 0 ){
		/* Auto-append the R+W flag */
		iFlags |= UNQLITE_OPEN_READWRITE;
	}
	if( iFlags & UNQLITE_OPEN_CREATE ){
		iFlags &= ~(UNQLITE_OPEN_MMAP|UNQLITE_OPEN_READONLY);
		/* Auto-append the R+W flag */
		iFlags |= UNQLITE_OPEN_READWRITE;
	}else{
		if( iFlags & UNQLITE_OPEN_READONLY ){
			iFlags &= ~UNQLITE_OPEN_READWRITE;
		}else if( iFlags & UNQLITE_OPEN_READWRITE ){
			iFlags &= ~UNQLITE_OPEN_MMAP;
		}
	}
	return iFlags;
}